

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.c
# Opt level: O1

natwm_error
button_handle_grab(natwm_state *state,xcb_button_press_event_t *event,xcb_rectangle_t *monitor_rect,
                  client *client)

{
  theme *ptVar1;
  uint16_t uVar2;
  xcb_window_t xVar3;
  natwm_error nVar4;
  uint32_t local_4c;
  uint32_t local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  undefined8 local_38;
  
  if (event->same_screen == '\0') {
    internal_logger(natwm_logger,LEVEL_ERROR,
                    "Receieved a grab event which did not occur on the root window");
    nVar4 = INVALID_INPUT_ERROR;
  }
  else if (state->button_state->grabbed_client == (client *)0x0) {
    nVar4 = NO_ERROR;
    if (client->is_fullscreen == false) {
      natwm_state_lock(state);
      state->button_state->grabbed_client = client;
      state->button_state->monitor_rect = monitor_rect;
      state->button_state->start_x = event->event_x;
      state->button_state->start_y = event->event_y;
      natwm_state_unlock(state);
      if (event->detail == '\x03') {
        if (state->button_state->resize_helper == 0) {
          natwm_state_lock(state);
          xVar3 = xcb_generate_id(state->xcb);
          ptVar1 = state->workspace_list->theme;
          local_4c = ptVar1->resize_background_color->color_value;
          local_48 = ptVar1->resize_border_color->color_value;
          local_44 = 1;
          xcb_create_window(state->xcb,0,xVar3,state->screen->root,0xffffffff,0xffffffff,1,1,0,0,
                            state->screen->root_visual,0x20a,&local_4c);
          xcb_icccm_set_wm_class(state->xcb,xVar3,0x22,"resize_helper_window");
          xcb_map_window(state->xcb,xVar3);
          xcb_flush(state->xcb);
          state->button_state->resize_helper = xVar3;
          natwm_state_unlock(state);
        }
        uVar2 = client_get_active_border_width(state->workspace_list->theme,client);
        local_4c = (int)monitor_rect->x + (int)(client->rect).x;
        local_48 = (int)monitor_rect->y + (int)(client->rect).y;
        local_44 = (uint)(client->rect).width;
        local_40 = (uint)(client->rect).height;
        local_3c = (uint)uVar2;
        local_38 = 0;
        xcb_configure_window_aux(state->xcb,state->button_state->resize_helper,0x5f);
        xcb_flush(state->xcb);
      }
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Attempting to grab a second client");
    nVar4 = RESOLUTION_FAILURE;
  }
  return nVar4;
}

Assistant:

enum natwm_error button_handle_grab(struct natwm_state *state,
                                    const xcb_button_press_event_t *event,
                                    xcb_rectangle_t *monitor_rect, struct client *client)
{
        if (!event->same_screen) {
                LOG_ERROR(natwm_logger,
                          "Receieved a grab event which did not occur on the root window");

                return INVALID_INPUT_ERROR;
        }

        if (state->button_state->grabbed_client != NULL) {
                LOG_ERROR(natwm_logger, "Attempting to grab a second client");

                return RESOLUTION_FAILURE;
        }

        if (client->is_fullscreen) {
                // Ignore clients if they are currently fullscreen
                return NO_ERROR;
        }

        natwm_state_lock(state);

        state->button_state->grabbed_client = client;
        state->button_state->monitor_rect = monitor_rect;
        state->button_state->start_x = event->event_x;
        state->button_state->start_y = event->event_y;

        natwm_state_unlock(state);

        if (event->detail == XCB_BUTTON_INDEX_3) {
                initialize_resize_helper(state, monitor_rect, client);
        }

        return NO_ERROR;
}